

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateInternalAccessorDefinitions
          (MessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor FVar1;
  FieldDescriptor *pFVar2;
  char *format_00;
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,&(this->super_FieldGenerator).variables_._M_t);
  if (this->implicit_weak_field_ != true) {
    format_00 = 
    "const $type$&\n$classname$::_Internal::$name$(const $classname$* msg) {\n  return *msg->$field_member$;\n}\n"
    ;
    goto LAB_002e390e;
  }
  Formatter::operator()<>
            (&local_48,
             "const ::$proto_ns$::MessageLite& $classname$::_Internal::$name$(\n    const $classname$* msg) {\n  if (msg->$name$_ != nullptr) {\n    return *msg->$name$_;\n  } else if ($type_default_instance_ptr$ != nullptr) {\n    return *reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n        $type_default_instance_ptr$);\n  } else {\n    return *::$proto_ns$::internal::ImplicitWeakMessage::default_instance();\n  }\n}\n"
            );
  Formatter::operator()<>
            (&local_48,
             "::$proto_ns$::MessageLite*\n$classname$::_Internal::mutable_$name$($classname$* msg) {\n"
            );
  pFVar2 = (this->super_FieldGenerator).descriptor_;
  FVar1 = pFVar2[1];
  if (((byte)FVar1 & 2) == 0) {
    if ((((byte)FVar1 & 0x60) == 0x20) && (*(char *)(*(long *)(pFVar2 + 0x10) + 0x3a) == '\x02')) {
      if ((((byte)FVar1 & 0x10) == 0) || (*(long *)(pFVar2 + 0x28) == 0)) goto LAB_002e38ee;
    }
    else if (((byte)FVar1 & 0x60) == 0x40) goto LAB_002e38ee;
    format_00 = 
    "  if (msg->$name$_ == nullptr) {\n    if ($type_default_instance_ptr$ == nullptr) {\n      msg->$name$_ = ::$proto_ns$::Arena::CreateMessage<\n          ::$proto_ns$::internal::ImplicitWeakMessage>(\n              msg->GetArenaForAllocation());\n    } else {\n      msg->$name$_ = \n          reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n              $type_default_instance_ptr$)->New(\n                  msg->GetArenaForAllocation());\n    }\n  }\n  return msg->$name$_;\n}\n"
    ;
  }
  else {
LAB_002e38ee:
    format_00 = 
    "  if (msg->$name$_ == nullptr) {\n    if ($type_default_instance_ptr$ == nullptr) {\n      msg->$name$_ = ::$proto_ns$::Arena::CreateMessage<\n          ::$proto_ns$::internal::ImplicitWeakMessage>(\n              msg->GetArenaForAllocation());\n    } else {\n      msg->$name$_ = \n          reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n              $type_default_instance_ptr$)->New(\n                  msg->GetArenaForAllocation());\n    }\n  }\n  return msg->$name$_;\n}\n"
    ;
    if (*(char *)(*(long *)(pFVar2 + 0x38) + 0x4f) == '\0') {
      Formatter::operator()<>(&local_48,"  msg->$set_hasbit$\n");
    }
  }
LAB_002e390e:
  Formatter::operator()<>(&local_48,format_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateInternalAccessorDefinitions(
    io::Printer* printer) const {
  // In theory, these accessors could be inline in _Internal. However, in
  // practice, the linker is then not able to throw them out making implicit
  // weak dependencies not work at all.
  Formatter format(printer, variables_);
  if (implicit_weak_field_) {
    // These private accessors are used by MergeFrom and
    // MergePartialFromCodedStream, and their purpose is to provide access to
    // the field without creating a strong dependency on the message type.
    format(
        "const ::$proto_ns$::MessageLite& $classname$::_Internal::$name$(\n"
        "    const $classname$* msg) {\n"
        "  if (msg->$name$_ != nullptr) {\n"
        "    return *msg->$name$_;\n"
        "  } else if ($type_default_instance_ptr$ != nullptr) {\n"
        "    return *reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n"
        "        $type_default_instance_ptr$);\n"
        "  } else {\n"
        "    return "
        "*::$proto_ns$::internal::ImplicitWeakMessage::default_instance();\n"
        "  }\n"
        "}\n");
    format(
        "::$proto_ns$::MessageLite*\n"
        "$classname$::_Internal::mutable_$name$($classname$* msg) {\n");
    if (HasHasbit(descriptor_)) {
      format("  msg->$set_hasbit$\n");
    }
    format(
        "  if (msg->$name$_ == nullptr) {\n"
        "    if ($type_default_instance_ptr$ == nullptr) {\n"
        "      msg->$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
        "          ::$proto_ns$::internal::ImplicitWeakMessage>(\n"
        "              msg->GetArenaForAllocation());\n"
        "    } else {\n"
        "      msg->$name$_ = \n"
        "          reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n"
        "              $type_default_instance_ptr$)->New(\n"
        "                  msg->GetArenaForAllocation());\n"
        "    }\n"
        "  }\n"
        "  return msg->$name$_;\n"
        "}\n");
  } else {
    // This inline accessor directly returns member field and is used in
    // Serialize such that AFDO profile correctly captures access information to
    // message fields under serialize.
    format(
        "const $type$&\n"
        "$classname$::_Internal::$name$(const $classname$* msg) {\n"
        "  return *msg->$field_member$;\n"
        "}\n");
  }
}